

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O0

__string_type * __thiscall
qclab::qasm2_abi_cxx11_
          (__string_type *__return_storage_ptr__,qclab *this,char *type,int qubit0,int qubit1)

{
  ostream *poVar1;
  stringstream local_1a8 [8];
  stringstream stream;
  ostream local_198 [376];
  int local_20;
  int local_1c;
  int qubit1_local;
  int qubit0_local;
  char *type_local;
  
  local_1c = (int)type;
  local_20 = qubit0;
  _qubit1_local = this;
  type_local = (char *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,(char *)_qubit1_local);
  poVar1 = std::operator<<(poVar1," q[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  poVar1 = std::operator<<(poVar1,"], q[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
  std::operator<<(poVar1,"];\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm2( const char type[] , const int qubit0 , const int qubit1 ) {
    std::stringstream stream ;
    stream << type << " q[" << qubit0 << "], q[" << qubit1 << "];\n" ;
    return stream.str() ;
  }